

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.h
# Opt level: O0

void dict_write(lzma_dict *dict,uint8_t *in,size_t *in_pos,size_t in_size,size_t *left)

{
  size_t sVar1;
  size_t *left_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_dict *dict_local;
  
  left_local = (size_t *)in_size;
  if (*left < in_size - *in_pos) {
    left_local = (size_t *)(*in_pos + *left);
  }
  sVar1 = lzma_bufcpy(in,in_pos,(size_t)left_local,dict->buf,&dict->pos,dict->limit);
  *left = *left - sVar1;
  if (dict->full < dict->pos) {
    dict->full = dict->pos;
  }
  return;
}

Assistant:

static inline void
dict_write(lzma_dict *restrict dict, const uint8_t *restrict in,
		size_t *restrict in_pos, size_t in_size,
		size_t *restrict left)
{
	// NOTE: If we are being given more data than the size of the
	// dictionary, it could be possible to optimize the LZ decoder
	// so that not everything needs to go through the dictionary.
	// This shouldn't be very common thing in practice though, and
	// the slowdown of one extra memcpy() isn't bad compared to how
	// much time it would have taken if the data were compressed.

	if (in_size - *in_pos > *left)
		in_size = *in_pos + *left;

	*left -= lzma_bufcpy(in, in_pos, in_size,
			dict->buf, &dict->pos, dict->limit);

	if (dict->pos > dict->full)
		dict->full = dict->pos;

	return;
}